

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O3

void __thiscall
Pubkey_CombinePubkeysTest_Test::~Pubkey_CombinePubkeysTest_Test
          (Pubkey_CombinePubkeysTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Pubkey, CombinePubkeysTest) {
  for (PubkeyCombineTestVector test_vector : combine_pubkey_test_vectors) {
    Pubkey pubkey1 = Pubkey(test_vector.pubkey1);
    Pubkey pubkey2 = Pubkey(test_vector.pubkey2);

    Pubkey combined = Pubkey::CombinePubkey(pubkey1, pubkey2);
    EXPECT_STREQ(test_vector.combined_pubkey.c_str(),
                 combined.GetHex().c_str());

    std::vector<Pubkey> pubkeys;
    pubkeys.push_back(pubkey1);
    pubkeys.push_back(pubkey2);
    combined = Pubkey::CombinePubkey(pubkeys);
    EXPECT_STREQ(test_vector.combined_pubkey.c_str(),
                 combined.GetHex().c_str());
  }
}